

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  string *psVar1;
  FILE *__stream;
  char *pcVar2;
  int iVar3;
  LogDestination *this;
  MutexLock l;
  MutexLock local_38;
  MutexLock local_30;
  
  local_38.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar3 != 0) goto LAB_0012e119;
  }
  this = (LogDestination *)(&log_destinations_)[severity];
  if (this == (LogDestination *)0x0) {
    this = (LogDestination *)operator_new(0xe0);
    LogDestination(this,severity,(char *)0x0);
    (&log_destinations_)[severity] = this;
  }
  local_30.mu_ = &(this->fileobject_).lock_;
  if ((this->fileobject_).lock_.is_safe_ == true) {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_30.mu_);
    if (iVar3 != 0) {
LAB_0012e119:
      abort();
    }
  }
  (this->fileobject_).base_filename_selected_ = true;
  psVar1 = &(this->fileobject_).base_filename_;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 != 0) {
    __stream = (FILE *)(this->fileobject_).file_;
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      (this->fileobject_).file_ = (FILE *)0x0;
      (this->fileobject_).rollover_attempt_ = 0x1f;
    }
    pcVar2 = (char *)(this->fileobject_).base_filename_._M_string_length;
    strlen(base_filename);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)base_filename);
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_30);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
  return;
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
					      const char* base_filename) {
  assert(severity >= 0 && severity < NUM_SEVERITIES);
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}